

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FxchMan.c
# Opt level: O2

void Fxch_ManCompressCubes(Vec_Wec_t *vCubes,Vec_Int_t *vLit2Cube)

{
  int i;
  Vec_Int_t *pVVar1;
  int i_00;
  int nSizeNew;
  
  nSizeNew = 0;
  for (i_00 = 0; i_00 < vLit2Cube->nSize; i_00 = i_00 + 1) {
    i = Vec_IntEntry(vLit2Cube,i_00);
    pVVar1 = Vec_WecEntry(vCubes,i);
    if (0 < pVVar1->nSize) {
      Vec_IntWriteEntry(vLit2Cube,nSizeNew,i);
      nSizeNew = nSizeNew + 1;
    }
  }
  Vec_IntShrink(vLit2Cube,nSizeNew);
  return;
}

Assistant:

static inline void Fxch_ManCompressCubes( Vec_Wec_t* vCubes,
                                          Vec_Int_t* vLit2Cube )
{
    int i,
        k = 0,
        CubeId;

    Vec_IntForEachEntry( vLit2Cube, CubeId, i )
        if ( Vec_IntSize(Vec_WecEntry(vCubes, CubeId)) > 0 )
            Vec_IntWriteEntry( vLit2Cube, k++, CubeId );

    Vec_IntShrink( vLit2Cube, k );
}